

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

MediumProperties * __thiscall
pbrt::RGBGridMedium::SamplePoint(RGBGridMedium *this,Point3f p,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  anon_class_32_1_5ef94505 convert_00;
  anon_class_32_1_5ef94505 convert_01;
  anon_class_32_1_5ef94505 convert_02;
  Vector3<float> v;
  Point3f p_00;
  bool bVar5;
  undefined8 *in_RDX;
  Bounds3<float> *in_RSI;
  MediumProperties *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar7 [64];
  undefined1 auVar15 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  Point3<float> PVar22;
  Vector3f VVar23;
  SampledSpectrum SVar24;
  anon_class_32_1_5ef94505 convert_1;
  SampledSpectrum Le;
  SampledSpectrum sigma_s;
  SampledSpectrum sigma_a;
  anon_class_32_1_5ef94505 convert;
  SampledGrid<pbrt::RGBIlluminantSpectrum> *in_stack_00000220;
  Tuple3<pbrt::Point3,_float> in_stack_00000238;
  array<float,_4> in_stack_00000270;
  SampledSpectrum *in_stack_fffffffffffffd68;
  SampledSpectrum *s;
  SampledSpectrum *in_stack_fffffffffffffd70;
  SampledSpectrum *this_00;
  float in_stack_fffffffffffffd7c;
  undefined8 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  float in_stack_fffffffffffffdc8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  Transform *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  undefined1 auVar6 [64];
  
  vmovlpd_avx(in_ZMM0._0_16_);
  auVar14 = ZEXT856(0);
  PVar22.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_ffffffffffffff3c;
  PVar22.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_ffffffffffffff38;
  PVar22.super_Tuple3<pbrt::Point3,_float>.z = in_stack_ffffffffffffff40;
  PVar22 = Transform::ApplyInverse<float>(in_stack_ffffffffffffff20,PVar22);
  auVar6._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar14;
  vmovlpd_avx(auVar6._0_16_);
  auVar14 = ZEXT856(0);
  p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffdc4;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffdc0;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdc8;
  VVar23 = Bounds3<float>::Offset(in_RSI,p_00);
  auVar7._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar14;
  vmovlpd_avx(auVar7._0_16_);
  auVar14 = (undefined1  [56])0x0;
  v.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffd80;
  v.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  v.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffd7c;
  Point3<float>::Point3<float>((Point3<float> *)0x971053,v);
  s = (SampledSpectrum *)*in_RDX;
  this_00 = (SampledSpectrum *)in_RDX[1];
  bVar5 = pstd::optional::operator_cast_to_bool((optional *)(in_RSI + 9));
  if (bVar5) {
    pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator->
              ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)0x9710e1);
    auVar15 = (undefined1  [56])0x0;
    auVar14 = ZEXT856(0);
    convert_00.lambda.lambda.values._8_8_ = this;
    convert_00.lambda.lambda.values._0_8_ = lambda;
    convert_00.lambda.pdf.values[0] = in_stack_00000270.values[0];
    convert_00.lambda.pdf.values[1] = in_stack_00000270.values[1];
    convert_00.lambda.pdf.values[2] = in_stack_00000270.values[2];
    convert_00.lambda.pdf.values[3] = in_stack_00000270.values[3];
    in_stack_fffffffffffffd68 = s;
    in_stack_fffffffffffffd70 = this_00;
    SVar24 = SampledGrid<pbrt::RGBUnboundedSpectrum>::
             Lookup<pbrt::RGBGridMedium::SamplePoint(pbrt::Point3<float>,pbrt::SampledWavelengths_const&)const::_lambda(pbrt::RGBUnboundedSpectrum)_1_>
                       ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)in_stack_00000220,
                        (Point3f)in_stack_00000238,convert_00);
    auVar16._0_8_ = SVar24.values.values._8_8_;
    auVar16._8_56_ = auVar14;
    auVar8._0_8_ = SVar24.values.values._0_8_;
    auVar8._8_56_ = auVar15;
    vmovlpd_avx(auVar8._0_16_);
    vmovlpd_avx(auVar16._0_16_);
  }
  else {
    SampledSpectrum::SampledSpectrum
              (in_stack_fffffffffffffd70,(Float)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  }
  auVar15 = (undefined1  [56])0x0;
  SVar24 = pbrt::operator*((Float)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                           in_stack_fffffffffffffd68);
  auVar17._0_8_ = SVar24.values.values._8_8_;
  auVar17._8_56_ = auVar14;
  auVar9._0_8_ = SVar24.values.values._0_8_;
  auVar9._8_56_ = auVar15;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  uVar2 = vmovlpd_avx(auVar17._0_16_);
  bVar5 = pstd::optional::operator_cast_to_bool
                    ((optional *)&in_RSI[0xb].pMin.super_Tuple3<pbrt::Point3,_float>.z);
  if (bVar5) {
    pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator->
              ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)0x9711e3);
    auVar15 = (undefined1  [56])0x0;
    auVar14 = ZEXT856(0);
    convert_01.lambda.lambda.values._8_8_ = this;
    convert_01.lambda.lambda.values._0_8_ = lambda;
    convert_01.lambda.pdf.values[0] = in_stack_00000270.values[0];
    convert_01.lambda.pdf.values[1] = in_stack_00000270.values[1];
    convert_01.lambda.pdf.values[2] = in_stack_00000270.values[2];
    convert_01.lambda.pdf.values[3] = in_stack_00000270.values[3];
    SVar24 = SampledGrid<pbrt::RGBUnboundedSpectrum>::
             Lookup<pbrt::RGBGridMedium::SamplePoint(pbrt::Point3<float>,pbrt::SampledWavelengths_const&)const::_lambda(pbrt::RGBUnboundedSpectrum)_1_>
                       ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)in_stack_00000220,
                        (Point3f)in_stack_00000238,convert_01);
    auVar18._0_8_ = SVar24.values.values._8_8_;
    auVar18._8_56_ = auVar14;
    auVar10._0_8_ = SVar24.values.values._0_8_;
    auVar10._8_56_ = auVar15;
    vmovlpd_avx(auVar10._0_16_);
    vmovlpd_avx(auVar18._0_16_);
  }
  else {
    SampledSpectrum::SampledSpectrum
              (in_stack_fffffffffffffd70,(Float)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    s = in_stack_fffffffffffffd68;
    this_00 = in_stack_fffffffffffffd70;
  }
  auVar15 = (undefined1  [56])0x0;
  SVar24 = pbrt::operator*((Float)((ulong)this_00 >> 0x20),s);
  auVar19._0_8_ = SVar24.values.values._8_8_;
  auVar19._8_56_ = auVar14;
  auVar11._0_8_ = SVar24.values.values._0_8_;
  auVar11._8_56_ = auVar15;
  uVar3 = vmovlpd_avx(auVar11._0_16_);
  uVar4 = vmovlpd_avx(auVar19._0_16_);
  SampledSpectrum::SampledSpectrum(this_00,(Float)((ulong)s >> 0x20));
  bVar5 = pstd::optional::operator_cast_to_bool
                    ((optional *)&in_RSI[6].pMin.super_Tuple3<pbrt::Point3,_float>.z);
  if ((bVar5) && (0.0 < in_RSI[8].pMax.super_Tuple3<pbrt::Point3,_float>.y)) {
    s = (SampledSpectrum *)*in_RDX;
    this_00 = (SampledSpectrum *)in_RDX[1];
    pstd::optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>_>::operator->
              ((optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>_> *)0x971329);
    auVar14 = (undefined1  [56])0x0;
    auVar15 = ZEXT856(0);
    convert_02.lambda.lambda.values._8_8_ = this;
    convert_02.lambda.lambda.values._0_8_ = lambda;
    convert_02.lambda.pdf.values[0] = in_stack_00000270.values[0];
    convert_02.lambda.pdf.values[1] = in_stack_00000270.values[1];
    convert_02.lambda.pdf.values[2] = in_stack_00000270.values[2];
    convert_02.lambda.pdf.values[3] = in_stack_00000270.values[3];
    SVar24 = SampledGrid<pbrt::RGBIlluminantSpectrum>::
             Lookup<pbrt::RGBGridMedium::SamplePoint(pbrt::Point3<float>,pbrt::SampledWavelengths_const&)const::_lambda(pbrt::RGBIlluminantSpectrum)_1_>
                       (in_stack_00000220,(Point3f)in_stack_00000238,convert_02);
    auVar20._0_8_ = SVar24.values.values._8_8_;
    auVar20._8_56_ = auVar15;
    auVar12._0_8_ = SVar24.values.values._0_8_;
    auVar12._8_56_ = auVar14;
    auVar14 = (undefined1  [56])0x0;
    vmovlpd_avx(auVar12._0_16_);
    vmovlpd_avx(auVar20._0_16_);
    SVar24 = pbrt::operator*((Float)((ulong)this_00 >> 0x20),s);
    auVar21._0_8_ = SVar24.values.values._8_8_;
    auVar21._8_56_ = auVar15;
    auVar13._0_8_ = SVar24.values.values._0_8_;
    auVar13._8_56_ = auVar14;
    local_1c8 = vmovlpd_avx(auVar13._0_16_);
    local_1c0 = vmovlpd_avx(auVar21._0_16_);
  }
  *(undefined8 *)(in_RDI->sigma_a).values.values = uVar1;
  *(undefined8 *)((in_RDI->sigma_a).values.values + 2) = uVar2;
  *(undefined8 *)(in_RDI->sigma_s).values.values = uVar3;
  *(undefined8 *)((in_RDI->sigma_s).values.values + 2) = uVar4;
  PhaseFunction::TaggedPointer<pbrt::HGPhaseFunction_const>
            ((PhaseFunction *)this_00,(HGPhaseFunction *)s);
  *(undefined8 *)(in_RDI->Le).values.values = local_1c8;
  *(undefined8 *)((in_RDI->Le).values.values + 2) = local_1c0;
  return in_RDI;
}

Assistant:

SamplePoint(Point3f p, const SampledWavelengths &lambda) const {
        p = renderFromMedium.ApplyInverse(p);
        p = Point3f(bounds.Offset(p));
        // Compute $\sigmaa$ and $\sigmas$ for _RGBGridMedium_
        auto convert = [=] PBRT_CPU_GPU(RGBUnboundedSpectrum s) {
            return s.Sample(lambda);
        };
        SampledSpectrum sigma_a =
            sigmaScale *
            (sigma_aGrid ? sigma_aGrid->Lookup(p, convert) : SampledSpectrum(1.f));
        SampledSpectrum sigma_s =
            sigmaScale *
            (sigma_sGrid ? sigma_sGrid->Lookup(p, convert) : SampledSpectrum(1.f));

        // Find emitted radiance _Le_ for _RGBGridMedium_
        SampledSpectrum Le(0.f);
        if (LeGrid && LeScale > 0) {
            auto convert = [=] PBRT_CPU_GPU(RGBIlluminantSpectrum s) {
                return s.Sample(lambda);
            };
            Le = LeScale * LeGrid->Lookup(p, convert);
        }

        return MediumProperties{sigma_a, sigma_s, &phase, Le};
    }